

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  ulong uVar1;
  value_type *__x;
  pointer pTVar2;
  pointer pAVar3;
  IArgFunction<Catch::ConfigData> *pIVar4;
  pointer pbVar5;
  bool bVar6;
  __type_conflict _Var7;
  Type TVar8;
  runtime_error *this_00;
  string *shortName;
  pointer pbVar9;
  pointer pAVar10;
  ulong uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  string local_228 [128];
  ostringstream oss;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = 0;
  do {
    pTVar2 = (tokens->
             super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tokens->
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28) <= uVar11
       ) {
      if (errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          errors.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        pbVar5 = errors.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = errors.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar5;
            pbVar9 = pbVar9 + 1) {
          if (pbVar9 != errors.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            std::operator<<((ostream *)&oss,"\n");
          }
          std::operator<<((ostream *)&oss,(string *)pbVar9);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_228);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&errors);
      return __return_storage_ptr__;
    }
    __x = pTVar2 + uVar11;
    pAVar3 = (this->m_options).
             super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    shortName = &pTVar2[uVar11].data;
    for (pAVar10 = (this->m_options).
                   super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_start; pAVar10 != pAVar3;
        pAVar10 = pAVar10 + 1) {
      TVar8 = __x->type;
      if (TVar8 == ShortOpt) {
        bVar6 = OptionArgProperties::hasShortName(&pAVar10->super_OptionArgProperties,shortName);
        if (!bVar6) {
          TVar8 = __x->type;
          goto LAB_00183327;
        }
LAB_00183347:
        if ((pAVar10->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length ==
            0) {
          pIVar4 = (pAVar10->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
          (*pIVar4->_vptr_IArgFunction[3])(pIVar4,config);
        }
        else {
          pTVar2 = (tokens->
                   super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar11 != ((long)(tokens->
                               super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28 -
                        1U) {
            uVar1 = uVar11 + 1;
            if (pTVar2[uVar1].type == Positional) {
              pIVar4 = (pAVar10->super_CommonArgProperties<Catch::ConfigData>).boundField.
                       functionObj;
              (*pIVar4->_vptr_IArgFunction[2])(pIVar4,config,&pTVar2[uVar1].data);
              uVar11 = uVar1;
              goto LAB_001834f6;
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                         "Expected argument to option: ",shortName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errors,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
          std::__cxx11::string::~string((string *)&oss);
        }
LAB_001834f6:
        if (pAVar10 != pAVar3) goto LAB_0018355a;
        break;
      }
LAB_00183327:
      if ((TVar8 == LongOpt) &&
         (_Var7 = std::operator==(shortName,&(pAVar10->super_OptionArgProperties).longName), _Var7))
      goto LAB_00183347;
    }
    if ((__x->type == Positional) || (this->m_throwOnUnrecognisedTokens == false)) {
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(__return_storage_ptr__,__x);
    }
    else if (errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                     "unrecognised option: ",shortName);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&errors,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
      std::__cxx11::string::~string((string *)&oss);
    }
LAB_0018355a:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            std::vector<std::string> errors;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    errors.push_back( "Expected argument to option: " + token.data );
                                else
                                    arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        errors.push_back( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd ) {
                    if( token.type == Parser::Token::Positional || !m_throwOnUnrecognisedTokens )
                        unusedTokens.push_back( token );
                    else if( errors.empty() && m_throwOnUnrecognisedTokens )
                        errors.push_back( "unrecognised option: " + token.data );
                }
            }
            if( !errors.empty() ) {
                std::ostringstream oss;
                for( std::vector<std::string>::const_iterator it = errors.begin(), itEnd = errors.end();
                        it != itEnd;
                        ++it ) {
                    if( it != errors.begin() )
                        oss << "\n";
                    oss << *it;
                }
                throw std::runtime_error( oss.str() );
            }
            return unusedTokens;
        }